

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

int trytypeattr(rnndb *db,char *file,xmlNode *node,xmlAttr *attr,rnntypeinfo *ti)

{
  xmlChar *__s1;
  int iVar1;
  uint64_t uVar2;
  char *pcVar3;
  
  __s1 = attr->name;
  iVar1 = strcmp((char *)__s1,"shr");
  if (iVar1 == 0) {
    uVar2 = getnumattrib(db,file,(uint)node->line,attr);
    ti->shr = (int)uVar2;
  }
  else {
    iVar1 = strcmp((char *)__s1,"add");
    if (iVar1 == 0) {
      uVar2 = getnumattrib(db,file,(uint)node->line,attr);
      ti->add = (int)uVar2;
    }
    else {
      iVar1 = strcmp((char *)__s1,"min");
      if (iVar1 == 0) {
        uVar2 = getnumattrib(db,file,(uint)node->line,attr);
        ti->min = uVar2;
        ti->minvalid = 1;
      }
      else {
        iVar1 = strcmp((char *)__s1,"max");
        if (iVar1 == 0) {
          uVar2 = getnumattrib(db,file,(uint)node->line,attr);
          ti->max = uVar2;
          ti->maxvalid = 1;
        }
        else {
          iVar1 = strcmp((char *)__s1,"align");
          if (iVar1 == 0) {
            uVar2 = getnumattrib(db,file,(uint)node->line,attr);
            ti->align = uVar2;
            ti->alignvalid = 1;
          }
          else {
            iVar1 = strcmp((char *)__s1,"type");
            if (iVar1 == 0) {
              pcVar3 = getattrib(db,file,(uint)node->line,attr);
              pcVar3 = strdup(pcVar3);
              ti->name = pcVar3;
            }
            else {
              iVar1 = strcmp((char *)__s1,"radix");
              if (iVar1 != 0) {
                return 0;
              }
              uVar2 = getnumattrib(db,file,(uint)node->line,attr);
              ti->radix = uVar2;
              ti->radixvalid = 1;
            }
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

static int trytypeattr (struct rnndb *db, char *file, xmlNode *node, xmlAttr *attr, struct rnntypeinfo *ti) {
	if (!strcmp(attr->name, "shr")) {
		ti->shr = getnumattrib(db, file, node->line, attr);
		return 1;
	} else if (!strcmp(attr->name, "add")) {
		ti->add = getnumattrib(db, file, node->line, attr);
		return 1;
	} else if (!strcmp(attr->name, "min")) {
		ti->min = getnumattrib(db, file, node->line, attr);
		ti->minvalid = 1;
		return 1;
	} else if (!strcmp(attr->name, "max")) {
		ti->max = getnumattrib(db, file, node->line, attr);
		ti->maxvalid = 1;
		return 1;
	} else if (!strcmp(attr->name, "align")) {
		ti->align = getnumattrib(db, file, node->line, attr);
		ti->alignvalid = 1;
		return 1;
	} else if (!strcmp(attr->name, "type")) {
		ti->name = strdup(getattrib(db, file, node->line, attr));;
		return 1;
	} else if (!strcmp(attr->name, "radix")) {
		ti->radix = getnumattrib(db, file, node->line, attr);
		ti->radixvalid = 1;
		return 1;
	}
	return 0;
}